

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.cpp
# Opt level: O2

void __thiscall
GrpcLikeMessageBuilder::GrpcLikeMessageBuilder
          (GrpcLikeMessageBuilder *this,GrpcLikeMessageBuilder *other)

{
  (this->super_AllocatorMember).member_allocator_.super_Allocator._vptr_Allocator =
       (_func_int **)&PTR__Allocator_001f0d00;
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            (&this->super_FlatBufferBuilder,0x400,(Allocator *)this,false,8);
  Swap(this,other);
  return;
}

Assistant:

GrpcLikeMessageBuilder(GrpcLikeMessageBuilder &&other)
      : FlatBufferBuilder(1024, &member_allocator_, false) {
    // Default construct and swap idiom.
    Swap(other);
  }